

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>::Match
          (ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_> *this,
          Matcher *matcher,char16 *input,CharCount inputLength,CharCount *inputOffset)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  Program *pPVar4;
  undefined4 *puVar5;
  char16_t **ppcVar6;
  CharCount *inputOffset_local;
  CharCount inputLength_local;
  char16 *input_local;
  Matcher *matcher_local;
  ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_> *this_local;
  
  uVar1 = (this->super_LiteralMixin).length;
  pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&matcher->program);
  if ((pPVar4->rep).insts.litbufLen - (this->super_LiteralMixin).offset < uVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x28d,"(length <= matcher.program->rep.insts.litbufLen - offset)",
                       "length <= matcher.program->rep.insts.litbufLen - offset");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&matcher->program);
  ppcVar6 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                      ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
  bVar3 = TextbookBoyerMooreWithLinearMap<char16_t>::Match<1u>
                    (&this->scanner,input,inputLength,inputOffset,
                     *ppcVar6 + (this->super_LiteralMixin).offset,(this->super_LiteralMixin).length,
                     matcher->stats);
  return bVar3;
}

Assistant:

inline bool
    ScannerMixinT<ScannerT>::Match(Matcher& matcher, const char16 * const input, const CharCount inputLength, CharCount& inputOffset) const
    {
        Assert(length <= matcher.program->rep.insts.litbufLen - offset);
        return scanner.template Match<1>(
            input
            , inputLength
            , inputOffset
            , matcher.program->rep.insts.litbuf + offset
            , length
#if ENABLE_REGEX_CONFIG_OPTIONS
            , matcher.stats
#endif
            );
    }